

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O0

void test_ht_5(void)

{
  int iVar1;
  spki_record *spki_record;
  spki_record *spki_record_00;
  long in_FS_OFFSET;
  spki_record *record2;
  spki_record *record1;
  spki_record *psStack_188;
  uint result_len;
  spki_record *result;
  spki_table table;
  
  table.lock._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  spki_record = create_record(10,10,10,(rtr_socket *)0x0);
  spki_record_00 = create_record(10,10,10,(rtr_socket *)0x0);
  spki_table_init((spki_table *)&result,(spki_update_fp)0x0);
  iVar1 = spki_table_add_entry((spki_table *)&result,spki_record);
  if (iVar1 != 0) {
    __assert_fail("spki_table_add_entry(&table, record1) == SPKI_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x17c,"void test_ht_5(void)");
  }
  iVar1 = spki_table_add_entry((spki_table *)&result,spki_record_00);
  if (iVar1 != -2) {
    __assert_fail("spki_table_add_entry(&table, record2) == SPKI_DUPLICATE_RECORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x17d,"void test_ht_5(void)");
  }
  iVar1 = spki_table_add_entry((spki_table *)&result,spki_record);
  if (iVar1 != -2) {
    __assert_fail("spki_table_add_entry(&table, record1) == SPKI_DUPLICATE_RECORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x17e,"void test_ht_5(void)");
  }
  spki_table_get_all((spki_table *)&result,10,spki_record->ski,&stack0xfffffffffffffe78,
                     (uint *)((long)&record1 + 4));
  if (record1._4_4_ == 1) {
    free(psStack_188);
    spki_table_free((spki_table *)&result);
    free(spki_record);
    free(spki_record_00);
    printf("%s() complete\n","test_ht_5");
    if (*(long *)(in_FS_OFFSET + 0x28) == table.lock._48_8_) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("result_len == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                ,0x185,"void test_ht_5(void)");
}

Assistant:

static void test_ht_5(void)
{
	struct spki_table table;
	/* create 2 equal records */
	struct spki_record *record1 = create_record(10, 10, 10, NULL);
	struct spki_record *record2 = create_record(10, 10, 10, NULL);

	/* create table and (try) add records -> check for duplicates */
	spki_table_init(&table, NULL);
	assert(spki_table_add_entry(&table, record1) == SPKI_SUCCESS);
	assert(spki_table_add_entry(&table, record2) == SPKI_DUPLICATE_RECORD);
	assert(spki_table_add_entry(&table, record1) == SPKI_DUPLICATE_RECORD);

	struct spki_record *result;
	unsigned int result_len;

	/* check that only record1 is in table and matches query */
	spki_table_get_all(&table, 10, record1->ski, &result, &result_len);
	assert(result_len == 1);
	free(result);

	/* cleanup: free memory */
	spki_table_free(&table);
	free(record1);
	free(record2);
	printf("%s() complete\n", __func__);
}